

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

bool duckdb::ApproxQuantileCoding::Decode<double,duckdb::dtime_tz_t>
               (double *source,dtime_tz_t *target)

{
  uint64_t uVar1;
  uint64_t *in_RSI;
  double *in_RDI;
  int64_t micros;
  int32_t offset;
  bool decoded;
  uint64_t sort_key;
  double *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  int32_t offset_00;
  dtime_tz_t *in_stack_fffffffffffffee8;
  dtime_t in_stack_fffffffffffffef0;
  LogicalType local_108 [24];
  LogicalType local_f0 [64];
  uint64_t local_b0;
  LogicalType local_98 [24];
  LogicalType local_80 [64];
  uint64_t local_40;
  dtime_t local_38;
  uint64_t local_30;
  long local_28;
  int32_t local_20;
  byte local_19;
  uint64_t local_18;
  uint64_t *local_10;
  double *local_8;
  
  offset_00 = (int32_t)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_19 = Decode<double,unsigned_long>(in_stack_fffffffffffffed8,(unsigned_long *)0x9b617c);
  if ((bool)local_19) {
    local_20 = dtime_tz_t::decode_offset(local_18);
    local_28 = dtime_tz_t::decode_micros(local_18);
    uVar1 = dtime_tz_t::encode_offset(local_20);
    local_28 = local_28 + uVar1 * -1000000;
    dtime_t::dtime_t(&local_38,local_28);
    dtime_tz_t::dtime_tz_t(in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,offset_00);
    *local_10 = local_30;
  }
  else if (0.0 < *local_8 || *local_8 == 0.0) {
    duckdb::LogicalType::LogicalType(local_108,TIME_TZ);
    duckdb::Value::MaximumValue(local_f0);
    local_b0 = (uint64_t)duckdb::Value::GetValue<duckdb::dtime_tz_t>();
    *local_10 = local_b0;
    duckdb::Value::~Value((Value *)local_f0);
    duckdb::LogicalType::~LogicalType(local_108);
  }
  else {
    duckdb::LogicalType::LogicalType(local_98,TIME_TZ);
    duckdb::Value::MinimumValue(local_80);
    local_40 = (uint64_t)duckdb::Value::GetValue<duckdb::dtime_tz_t>();
    *local_10 = local_40;
    duckdb::Value::~Value((Value *)local_80);
    duckdb::LogicalType::~LogicalType(local_98);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool ApproxQuantileCoding::Decode(const double &source, dtime_tz_t &target) {
	uint64_t sort_key;
	const auto decoded = Decode<double, uint64_t>(source, sort_key);
	if (decoded) {
		//	We can invert the sort key because its offset was not touched.
		auto offset = dtime_tz_t::decode_offset(sort_key);
		auto micros = dtime_tz_t::decode_micros(sort_key);
		micros -= int64_t(dtime_tz_t::encode_offset(offset) * dtime_tz_t::OFFSET_MICROS);
		target = dtime_tz_t(dtime_t(micros), offset);
	} else if (source < 0) {
		target = Value::MinimumValue(LogicalTypeId::TIME_TZ).GetValue<dtime_tz_t>();
	} else {
		target = Value::MaximumValue(LogicalTypeId::TIME_TZ).GetValue<dtime_tz_t>();
	}

	return decoded;
}